

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.c
# Opt level: O2

int get_random_numbers(uint64_t *buffer,size_t count,uint64_t b)

{
  ulong *__ptr;
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  
  __stream = fopen("/dev/urandom","r");
  if (__stream == (FILE *)0x0) {
    iVar1 = -1;
  }
  else {
    sVar2 = fread(buffer,8,count,__stream);
    iVar4 = (int)count - (int)sVar2;
    for (sVar3 = 0; sVar3 != count; sVar3 = sVar3 + 1) {
      __ptr = buffer + sVar3;
      while (~(0xffffffffffffffffU % b) <= *__ptr) {
        sVar2 = fread(__ptr,8,1,__stream);
        iVar4 = (iVar4 - (int)sVar2) + 1;
      }
      *__ptr = *__ptr % b;
    }
    iVar1 = fclose(__stream);
    iVar1 = iVar1 - iVar4;
  }
  return iVar1;
}

Assistant:

int get_random_numbers(uint64_t buffer[], size_t count, uint64_t b) {

    #if defined(__linux__) || defined(__APPLE__)

        uint64_t bad = UINT64_MAX - (UINT64_MAX % b);
        FILE* f = fopen("/dev/urandom", "r");
        if(f == NULL)
            return -1;
        int err = 0;
        err += count - fread(buffer, sizeof(uint64_t), count, f);
        for(size_t i = 0; i < count; i++) {
            while(buffer[i] >= bad) {
                err += 1 - fread(&(buffer[i]), sizeof(uint64_t), 1, f);
            }
            buffer[i] %= b;
        }
        err -= fclose(f);
        return -err;

    #elif _WIN32

        uint64_t bad = UINT64_MAX - (UINT64_MAX % b);
        HMODULE hmod = LoadLibrary("advapi32.dll");
        if(hmod == NULL)
            return -1;
        BOOLEAN (APIENTRY* RtlGenRandom_ptr)(PVOID, ULONG) = (BOOLEAN (APIENTRY*)(PVOID, ULONG)) GetProcAddress(hmod, "SystemFunction036");
        if(!RtlGenRandom_ptr) {
            FreeLibrary(hmod);
            return -1;
        }
        int err = 0;
        if(!RtlGenRandom_ptr(buffer, count * sizeof(uint64_t)))
            err++;
        for(size_t i = 0; i < count; i++) {
            while(buffer[i] >= bad) {
                if(!RtlGenRandom_ptr(&(buffer[i]), sizeof(uint64_t)))
                    err++;
            }
            buffer[i] %= b;
        }
        if(!FreeLibrary(hmod))
            err++;
        return -err;

    #endif

}